

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_pcm.cpp
# Opt level: O1

uint32_t __thiscall
ymfm::pcm_registers::effective_rate(pcm_registers *this,uint32_t raw,uint32_t correction)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  if (raw != 0) {
    if (raw != 0xf) {
      uVar1 = correction + raw * 4;
      uVar2 = 0x3f;
      if ((int)uVar1 < 0x3f) {
        uVar2 = uVar1;
      }
      uVar1 = 0;
      if (0 < (int)uVar2) {
        uVar1 = uVar2;
      }
      return uVar1;
    }
    raw = 0x3f;
  }
  return raw;
}

Assistant:

uint32_t pcm_registers::effective_rate(uint32_t raw, uint32_t correction)
{
	// raw rates of 0 and 15 just pin to min/max
	if (raw == 0)
		return 0;
	if (raw == 15)
		return 63;

	// otherwise add the correction and clamp to range
	return clamp(raw * 4 + correction, 0, 63);
}